

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O2

void emit_lib(BuildCtx *ctx)

{
  char **ppcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  int *piVar5;
  FILE *pFVar6;
  char *__format;
  char *pcVar7;
  uint8_t *__s;
  size_t sStack_150;
  undefined8 local_140;
  char buf [256];
  
  if (ctx->mode - BUILD_ffdef < 3) {
    pFVar6 = (FILE *)ctx->fp;
    pcVar7 = "/* This is a generated file. DO NOT EDIT! */\n\n";
    sStack_150 = 0x2e;
LAB_0010a9dc:
    fwrite(pcVar7,sStack_150,1,pFVar6);
    if (ctx->mode == BUILD_recdef) {
      fwrite("static const uint16_t recff_idmap[] = {\n0,\n0x0100",0x31,1,(FILE *)ctx->fp);
    }
  }
  else if (ctx->mode == BUILD_vmdef) {
    pFVar6 = (FILE *)ctx->fp;
    pcVar7 = "ffnames = {\n[0]=\"Lua\",\n\"C\",\n";
    sStack_150 = 0x1c;
    goto LAB_0010a9dc;
  }
  ffasmfunc = 0;
  ffid = 2;
  recffid = ffid;
  while( true ) {
    ppcVar1 = ctx->args;
    ctx->args = ppcVar1 + 1;
    pcVar7 = *ppcVar1;
    if (pcVar7 == (char *)0x0) break;
    if ((*pcVar7 == '-') && (pcVar7[1] == '\0')) {
      local_140 = _stdin;
    }
    else {
      local_140 = fopen(pcVar7,"r");
      pFVar6 = _stderr;
      if (local_140 == (FILE *)0x0) {
        piVar5 = __errno_location();
        pcVar3 = strerror(*piVar5);
        __format = "Error: cannot open input file \'%s\': %s\n";
LAB_0010accb:
        fprintf(pFVar6,__format,pcVar7,pcVar3);
        exit(1);
      }
    }
    modstate = 0;
    regfunc = 0;
LAB_0010aa75:
    pcVar7 = fgets(buf,0x100,local_140);
    if (pcVar7 != (char *)0x0) {
      if ((((buf[0] == '#') && (buf[1] == 'i')) && (buf[2] == 'f')) &&
         ((iVar2 = bcmp(buf,"#if LJ_52\n",0xb), iVar2 == 0 ||
          (iVar2 = bcmp(buf,"#if LJ_52\r\n",0xc), iVar2 == 0)))) {
        iVar2 = 1;
        do {
          while( true ) {
            pcVar7 = fgets(buf,0x100,local_140);
            if (pcVar7 == (char *)0x0) goto LAB_0010aa75;
            if (buf[2] == 'n' && (buf[1] == 'e' && (byte)(buf[0] ^ 0x23U) == 0)) break;
            iVar2 = iVar2 + (uint)(buf[2] == 'f' && ((byte)(buf[0] ^ 0x23U) == 0 && buf[1] == 'i'));
          }
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      else {
        pcVar3 = buf;
        while (pcVar3 = strstr(pcVar3,"LJLIB_"), pcVar3 != (char *)0x0) {
          pcVar3 = pcVar3 + 6;
          piVar5 = &libdef_handlers[0].arg;
          while( true ) {
            pcVar7 = ((LibDefHandler *)(piVar5 + -6))->suffix;
            if (pcVar7 == (char *)0x0) {
              sVar4 = strlen(buf);
              buf[sVar4 - 1] = '\0';
              __format = "Error: unknown library definition tag %s%s\n";
              pcVar7 = "LJLIB_";
              pFVar6 = _stderr;
              goto LAB_0010accb;
            }
            sVar4 = strlen(pcVar7);
            iVar2 = strncmp(pcVar3,pcVar7,sVar4);
            if (iVar2 == 0) break;
            piVar5 = piVar5 + 8;
          }
          pcVar3 = pcVar3 + sVar4;
          if (*(char **)(piVar5 + -4) == (char *)0x0) {
            sVar4 = 0;
          }
          else {
            sVar4 = strcspn(pcVar3,*(char **)(piVar5 + -4));
          }
          if (pcVar3[sVar4] != '\0') {
            pcVar3[sVar4] = '\0';
            (**(LibDefFunc *)(piVar5 + -2))(ctx,pcVar3,*piVar5);
            pcVar3 = pcVar3 + sVar4 + 1;
          }
        }
      }
      goto LAB_0010aa75;
    }
    fclose(local_140);
    if (ctx->mode == BUILD_libdef) {
      libdef_endmodule(ctx);
    }
  }
  switch(ctx->mode) {
  case BUILD_bcdef:
    fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
    fwrite("LJ_DATADEF const uint16_t lj_bc_mode[] = {\n",0x2b,1,(FILE *)ctx->fp);
    fwrite("BCDEF(BCMODE)\n",0xe,1,(FILE *)ctx->fp);
    for (iVar2 = ffasmfunc; 1 < iVar2; iVar2 = iVar2 + -1) {
      fwrite("BCMODE_FF,\n",0xb,1,(FILE *)ctx->fp);
    }
    pFVar6 = (FILE *)ctx->fp;
    pcVar7 = "BCMODE_FF\n};\n\n";
    sStack_150 = 0xe;
    break;
  case BUILD_ffdef:
    fwrite("\n#undef FFDEF\n\n",0xf,1,(FILE *)ctx->fp);
    fprintf((FILE *)ctx->fp,"#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
            (ulong)(uint)ffasmfunc);
    return;
  default:
    goto switchD_0010ac26_caseD_7;
  case BUILD_recdef:
    fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
    fwrite("static const RecordFunc recff_func[] = {\nrecff_nyi,\nrecff_c",0x3b,1,(FILE *)ctx->fp);
    for (__s = obuf; pFVar6 = (FILE *)ctx->fp, *__s != '\0'; __s = __s + sVar4 + 1) {
      fprintf(pFVar6,",\nrecff_%s",__s);
      sVar4 = strlen((char *)__s);
    }
    pcVar7 = "\n};\n\n";
    sStack_150 = 5;
    break;
  case BUILD_vmdef:
    pFVar6 = (FILE *)ctx->fp;
    pcVar7 = "},\n\n";
    sStack_150 = 4;
  }
  fwrite(pcVar7,sStack_150,1,pFVar6);
switchD_0010ac26_caseD_7:
  return;
}

Assistant:

void emit_lib(BuildCtx *ctx)
{
  const char *fname;

  if (ctx->mode == BUILD_ffdef || ctx->mode == BUILD_libdef ||
      ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "/* This is a generated file. DO NOT EDIT! */\n\n");
  else if (ctx->mode == BUILD_vmdef)
    fprintf(ctx->fp, "ffnames = {\n[0]=\"Lua\",\n\"C\",\n");
  if (ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "static const uint16_t recff_idmap[] = {\n0,\n0x0100");
  recffid = ffid = FF_C+1;
  ffasmfunc = 0;

  while ((fname = *ctx->args++)) {
    char buf[256];  /* We don't care about analyzing lines longer than that. */
    FILE *fp;
    if (fname[0] == '-' && fname[1] == '\0') {
      fp = stdin;
    } else {
      fp = fopen(fname, "r");
      if (!fp) {
	fprintf(stderr, "Error: cannot open input file '%s': %s\n",
		fname, strerror(errno));
	exit(1);
      }
    }
    modstate = 0;
    regfunc = REGFUNC_OK;
    while (fgets(buf, sizeof(buf), fp) != NULL) {
      char *p;
      /* Simplistic pre-processor. Only handles top-level #if/#endif. */
      if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
        int ok = 1;
        if (!strcmp(buf, "#if LJ_52\n") || !strcmp(buf, "#if LJ_52\r\n"))
          ok = LJ_52;
        else if (!strcmp(buf, "#if LJ_HASJIT\n") || !strcmp(buf, "#if LJ_HASJIT\r\n"))
          ok = LJ_HASJIT;
        else if (!strcmp(buf, "#if LJ_HASFFI\n") || !strcmp(buf, "#if LJ_HASFFI\r\n"))
          ok = LJ_HASFFI;
        else if (!strcmp(buf, "#if LJ_HASBUFFER\n") || !strcmp(buf, "#if LJ_HASBUFFER\r\n"))
          ok = LJ_HASBUFFER;
        if (!ok) {
          int lvl = 1;
          while (fgets(buf, sizeof(buf), fp) != NULL) {
            if (buf[0] == '#' && buf[1] == 'e' && buf[2] == 'n') {
              if (--lvl == 0) break;
            } else if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
              lvl++;
            }
          }
          continue;
        }
      }
      for (p = buf; (p = strstr(p, LIBDEF_PREFIX)) != NULL; ) {
        const LibDefHandler *ldh;
        p += sizeof(LIBDEF_PREFIX)-1;
        for (ldh = libdef_handlers; ldh->suffix != NULL; ldh++) {
          size_t n, len = strlen(ldh->suffix);
          if (!strncmp(p, ldh->suffix, len)) {
            p += len;
            n = ldh->stop ? strcspn(p, ldh->stop) : 0;
            if (!p[n]) break;
            p[n] = '\0';
            ldh->func(ctx, p, ldh->arg);
            p += n+1;
            break;
          }
        }
        if (ldh->suffix == NULL) {
          buf[strlen(buf)-1] = '\0';
          fprintf(stderr, "Error: unknown library definition tag %s%s\n",
            LIBDEF_PREFIX, p);
          exit(1);
        }
      }
    }
    fclose(fp);
    if (ctx->mode == BUILD_libdef) {
      libdef_endmodule(ctx);
    }
  }

  if (ctx->mode == BUILD_ffdef) {
    fprintf(ctx->fp, "\n#undef FFDEF\n\n");
    fprintf(ctx->fp,
      "#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
      ffasmfunc);
  } else if (ctx->mode == BUILD_vmdef) {
    fprintf(ctx->fp, "},\n\n");
  } else if (ctx->mode == BUILD_bcdef) {
    int i;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "LJ_DATADEF const uint16_t lj_bc_mode[] = {\n");
    fprintf(ctx->fp, "BCDEF(BCMODE)\n");
    for (i = ffasmfunc-1; i > 0; i--)
      fprintf(ctx->fp, "BCMODE_FF,\n");
    fprintf(ctx->fp, "BCMODE_FF\n};\n\n");
  } else if (ctx->mode == BUILD_recdef) {
    char *p = (char *)obuf;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "static const RecordFunc recff_func[] = {\n"
	    "recff_nyi,\n"
	    "recff_c");
    while (*p) {
      fprintf(ctx->fp, ",\nrecff_%s", p);
      p += strlen(p)+1;
    }
    fprintf(ctx->fp, "\n};\n\n");
  }
}